

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::session_stats_header_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_stats_header_alert *this)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 *puVar5;
  bool bVar6;
  ulong uVar7;
  stats_metric *s;
  undefined8 *puVar8;
  __normal_iterator<libtorrent::stats_metric_*,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
  __i;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> stats;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"session stats header: ","");
  session_stats_metrics();
  if (local_40 != local_38) {
    uVar7 = (long)local_38 - (long)local_40 >> 4;
    lVar4 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
              (local_40,local_38,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)local_38 - (long)local_40 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
                (local_40,local_38);
    }
    else {
      puVar8 = local_40 + 0x20;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
                (local_40,puVar8);
      for (; puVar8 != local_38; puVar8 = puVar8 + 2) {
        uVar2 = *puVar8;
        uVar3 = puVar8[1];
        iVar1 = *(int *)(puVar8 + -1);
        puVar5 = puVar8;
        while ((int)uVar3 < iVar1) {
          *puVar5 = puVar5[-2];
          puVar5[1] = puVar5[-1];
          iVar1 = *(int *)(puVar5 + -3);
          puVar5 = puVar5 + -2;
        }
        *puVar5 = uVar2;
        puVar5[1] = uVar3;
      }
    }
  }
  if (local_40 != local_38) {
    bVar6 = true;
    puVar8 = local_40;
    do {
      if (!bVar6) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      puVar8 = puVar8 + 2;
      bVar6 = false;
    } while (puVar8 != local_38);
  }
  if (local_40 != (undefined8 *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string session_stats_header_alert::message() const
	{
		std::string stats_header = "session stats header: ";
		std::vector<stats_metric> stats = session_stats_metrics();
		std::sort(stats.begin(), stats.end()
			, [] (stats_metric const& lhs, stats_metric const& rhs)
			{ return lhs.value_index < rhs.value_index; });
		bool first = true;
		for (auto const& s : stats)
		{
			if (!first) stats_header += ", ";
			stats_header += s.name;
			first = false;
		}

		return stats_header;
	}